

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

GLXWindow __thiscall tcu::x11::glx::GlxVisual::createWindow(GlxVisual *this,Window xWindow)

{
  Display *pDVar1;
  unsigned_long uVar2;
  Window xWindow_local;
  GlxVisual *this_local;
  
  pDVar1 = getXDisplay(this);
  uVar2 = glXCreateWindow(pDVar1,this->m_fbConfig,xWindow,0);
  uVar2 = checkGLX<unsigned_long>
                    (uVar2,"glXCreateWindow(getXDisplay(), m_fbConfig, xWindow, NULL)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                     ,0x182);
  return uVar2;
}

Assistant:

GLXWindow GlxVisual::createWindow (::Window xWindow)
{
	return TCU_CHECK_GLX(glXCreateWindow(getXDisplay(), m_fbConfig, xWindow, NULL));
}